

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

char tcu::(anonymous_namespace)::convertSat<signed_char,int>(int src)

{
  char cVar1;
  int max;
  int min;
  int src_local;
  
  min._3_1_ = std::numeric_limits<signed_char>::min();
  cVar1 = std::numeric_limits<signed_char>::max();
  if ((min._3_1_ <= src) && (min._3_1_ = cVar1, src <= cVar1)) {
    min._3_1_ = (char)src;
  }
  return min._3_1_;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}